

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O0

Chars * sentencepiece::normalizer::anon_unknown_1::Normalize
                  (CharsMap *chars_map,Chars *src,int max_len)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  allocator_type *paVar4;
  unsigned_long *puVar5;
  pointer this;
  size_type sVar6;
  int in_ECX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  Chars *in_RDI;
  Chars key;
  size_t slice;
  const_iterator it;
  size_t i;
  Chars *normalized;
  map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_fffffffffffffeb8;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffec0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_fffffffffffffec8;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffed0;
  const_iterator in_stack_fffffffffffffed8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  ostream *in_stack_fffffffffffffef0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffef8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff00;
  _Self local_b0;
  _Self local_a8;
  _Base_ptr local_a0;
  undefined1 local_91 [9];
  uint *local_88;
  uint *local_80;
  uint *local_78;
  size_type local_58;
  allocator_type *local_50;
  unsigned_long local_48;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  allocator_type *local_38;
  undefined1 local_2d;
  byte local_1e;
  Die local_1d;
  int local_1c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  
  local_1e = 0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  if (in_ECX < 1) {
    error::Die::Die(&local_1d,true);
    local_1e = 1;
    pcVar2 = logging::BaseName((char *)in_stack_fffffffffffffeb8);
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x7a);
    in_stack_ffffffffffffff00._M_current = (uint *)std::operator<<(poVar3,") [");
    in_stack_fffffffffffffef8._M_current =
         (uint *)std::operator<<((ostream *)in_stack_ffffffffffffff00._M_current,"(max_len) >= (1)")
    ;
    in_stack_fffffffffffffef0 =
         std::operator<<((ostream *)in_stack_fffffffffffffef8._M_current,"] ");
    error::Die::operator&(&local_1d,in_stack_fffffffffffffef0);
  }
  if ((local_1e & 1) != 0) {
    error::Die::~Die((Die *)in_stack_fffffffffffffec0.container);
  }
  local_2d = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x4e6f7b);
  local_38 = (allocator_type *)0x0;
  do {
    __first._M_current = (uint *)local_38;
    paVar4 = (allocator_type *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
    if (paVar4 <= __first._M_current) {
      return in_RDI;
    }
    local_40._M_current =
         (uint *)std::
                 map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::end(in_stack_fffffffffffffeb8);
    local_50 = local_38 + local_1c;
    local_58 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
    puVar5 = std::min<unsigned_long>((unsigned_long *)&local_50,&local_58);
    local_48 = *puVar5;
    local_80 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_fffffffffffffeb8);
    local_78 = (uint *)__gnu_cxx::
                       __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator+(in_stack_fffffffffffffec8,
                                   (difference_type)in_stack_fffffffffffffec0.container);
    local_91._1_8_ =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb8
                   );
    local_88 = (uint *)__gnu_cxx::
                       __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator+(in_stack_fffffffffffffec8,
                                   (difference_type)in_stack_fffffffffffffec0.container);
    __last._M_current = (uint *)local_91;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x4e708d);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffef0,
               in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (allocator_type *)__first._M_current);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x4e70be);
    while (bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                             (in_stack_fffffffffffffed0.container), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffed8 =
           std::
           map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::find(in_stack_fffffffffffffeb8,(key_type *)0x4e70eb);
      local_a0 = in_stack_fffffffffffffed8._M_node;
      local_40._M_current = (uint *)in_stack_fffffffffffffed8;
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::end(in_stack_fffffffffffffeb8);
      bVar1 = std::operator!=((_Self *)&local_40,&local_a8);
      if (bVar1) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x4e71d2);
    }
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
         ::end(in_stack_fffffffffffffeb8);
    bVar1 = std::operator==((_Self *)&local_40,&local_b0);
    if (bVar1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (local_18,(size_type)local_38);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (in_stack_fffffffffffffed0.container,
                 (value_type_conflict4 *)in_stack_fffffffffffffec8);
      local_38 = local_38 + 1;
    }
    else {
      in_stack_fffffffffffffec8 = &local_40;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)0x4e7256);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb8);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)0x4e7274);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffed0 =
           std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffec0 =
           std::
           copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                     (__first,__last,
                      (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       )in_stack_fffffffffffffed8._M_node);
      this = std::
             _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)0x4e72e1);
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->first);
      local_38 = local_38 + sVar6;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              (in_stack_fffffffffffffed0.container);
  } while( true );
}

Assistant:

Builder::Chars Normalize(const Builder::CharsMap &chars_map,
                         const Builder::Chars &src, int max_len) {
  CHECK_GE(max_len, 1);
  Builder::Chars normalized;

  for (size_t i = 0; i < src.size();) {
    Builder::CharsMap::const_iterator it = chars_map.end();
    const size_t slice = std::min<size_t>(i + max_len, src.size());
    // starts with the longest prefix.
    Builder::Chars key(src.begin() + i, src.begin() + slice);
    while (!key.empty()) {
      it = chars_map.find(key);
      if (it != chars_map.end()) {
        break;
      }
      key.pop_back();  // remove the last character.
    }

    // Consumes one character when no rule is found.
    if (it == chars_map.end()) {
      normalized.push_back(src[i]);
      ++i;
    } else {
      std::copy(it->second.begin(), it->second.end(),
                std::back_inserter(normalized));
      i += it->first.size();
    }
  }

  return normalized;
}